

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utVertexTriangleAdjacency.cpp
# Opt level: O2

void __thiscall
VTAdjacencyTest_unreferencedVerticesSet_Test::TestBody
          (VTAdjacencyTest_unreferencedVerticesSet_Test *this)

{
  aiFace *paVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  int *piVar5;
  long lVar6;
  VTAdjacencyTest *this_00;
  int iVar7;
  aiMesh mesh;
  
  aiMesh::aiMesh(&mesh);
  mesh.mNumVertices = 500;
  mesh.mNumFaces = 600;
  this_00 = (VTAdjacencyTest *)0x2588;
  puVar4 = (undefined8 *)operator_new__(0x2588);
  *puVar4 = 600;
  lVar6 = 0x10;
  do {
    *(undefined4 *)((long)puVar4 + lVar6 + -8) = 0;
    *(undefined8 *)((long)puVar4 + lVar6) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x2590);
  mesh.mFaces = (aiFace *)(puVar4 + 1);
  iVar7 = 0;
  lVar6 = 8;
  do {
    paVar1 = mesh.mFaces;
    if (lVar6 == 0x2588) {
      VTAdjacencyTest::checkMesh(this_00,&mesh);
      aiMesh::~aiMesh(&mesh);
      return;
    }
    *(undefined4 *)((long)mesh.mFaces + lVar6 + -8) = 3;
    this_00 = (VTAdjacencyTest *)0xc;
    piVar5 = (int *)operator_new__(0xc);
    *(int **)((long)&paVar1->mNumIndices + lVar6) = piVar5;
    iVar3 = 0;
    if (iVar7 != 499) {
      iVar3 = iVar7;
    }
    *piVar5 = iVar3;
    iVar2 = 0;
    if (iVar3 + 1 != 499) {
      iVar2 = iVar3 + 1;
    }
    *(int *)(*(long *)((long)&paVar1->mNumIndices + lVar6) + 4) = iVar2;
    iVar7 = 0;
    if (iVar2 + 1 != 499) {
      iVar7 = iVar2 + 1;
    }
    *(int *)(*(long *)((long)&paVar1->mNumIndices + lVar6) + 8) = iVar7;
    iVar3 = rand();
    piVar5 = *(int **)((long)&paVar1->mNumIndices + lVar6);
    if ((iVar3 < 0x40000000) || (iVar3 = *piVar5, iVar3 == 0)) {
      iVar3 = piVar5[1];
      if (iVar3 != 0) {
        piVar5 = piVar5 + 1;
        goto LAB_0038b026;
      }
    }
    else {
LAB_0038b026:
      *piVar5 = iVar3 + -1;
    }
    iVar7 = iVar7 + 1;
    lVar6 = lVar6 + 0x10;
  } while( true );
}

Assistant:

TEST_F(VTAdjacencyTest, unreferencedVerticesSet)
{
    // build a test mesh which does not reference all vertices
    // *******************************************************************************
    aiMesh mesh;

    mesh.mNumVertices = 500;
    mesh.mNumFaces = 600;

    mesh.mFaces = new aiFace[600];
    unsigned int iCurrent = 0;
    for (unsigned int i = 0; i < 600;++i)
    {
        aiFace& face = mesh.mFaces[i];
        face.mNumIndices = 3;
        face.mIndices = new unsigned int[3];

        if (499 == iCurrent)iCurrent = 0;
        face.mIndices[0] = iCurrent++;

        if (499 == iCurrent)iCurrent = 0;
        face.mIndices[1] = iCurrent++;

        if (499 == iCurrent)iCurrent = 0;
        face.mIndices[2] = iCurrent++;

        if (rand() > RAND_MAX/2 && face.mIndices[0])
        {
            face.mIndices[0]--;
        }
        else if (face.mIndices[1]) face.mIndices[1]--;
    }

    checkMesh(mesh);
}